

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool close_connection,bool *connection_closed,
          function<void_(httplib::Request_&)> *setup_request)

{
  array<char,_2048UL> *this_00;
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  pointer fixed_buffer;
  FILE *__stream;
  ulong uVar4;
  size_t sVar5;
  char *s;
  size_t *__n;
  Stream *__lineptr;
  bool local_d4e;
  exception *e;
  char *pcStack_ce0;
  bool routed;
  int local_cd4;
  undefined1 local_cd0 [4];
  int status;
  string local_cb0;
  string *local_c90;
  string *range_header_value;
  byte local_c61;
  string local_c60;
  string local_c40;
  undefined1 local_c20 [8];
  Headers dummy_1;
  Headers dummy;
  Response res;
  Request req;
  undefined1 local_878 [8];
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  function<void_(httplib::Request_&)> *setup_request_local;
  bool *connection_closed_local;
  bool close_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  this_00 = (array<char,_2048UL> *)(&line_reader.glowable_buffer_.field_2._M_allocated_capacity + 1)
  ;
  memset(this_00,0,0x800);
  fixed_buffer = std::array<char,_2048UL>::data(this_00);
  __stream = (FILE *)std::array<char,_2048UL>::size(this_00);
  __lineptr = strm;
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm,fixed_buffer,(size_t)__stream);
  uVar4 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_878,(char **)__lineptr,__n,__stream);
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = 0;
    req.authorization_count_._0_4_ = 1;
    goto LAB_001395c5;
  }
  Request::Request((Request *)&res.is_chunked_content_provider_);
  psVar1 = &dummy._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Response::Response((Response *)psVar1);
  std::__cxx11::string::operator=((string *)psVar1,"HTTP/1.1");
  iVar3 = (*strm->_vptr_Stream[7])();
  if (iVar3 < 0x400) {
    sVar5 = detail::stream_line_reader::size((stream_line_reader *)local_878);
    if (sVar5 < 0x2001) {
      s = detail::stream_line_reader::ptr((stream_line_reader *)local_878);
      bVar2 = parse_request_line(this,s,(Request *)&res.is_chunked_content_provider_);
      if ((bVar2) &&
         (bVar2 = detail::read_headers(strm,(Headers *)((long)&req.path.field_2 + 8)), bVar2)) {
        Request::get_header_value_abi_cxx11_
                  (&local_c40,(Request *)&res.is_chunked_content_provider_,"Connection",0);
        bVar2 = std::operator==(&local_c40,"close");
        std::__cxx11::string::~string((string *)&local_c40);
        if (bVar2) {
          *connection_closed = true;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&req.remote_port,"HTTP/1.0");
        local_c61 = 0;
        local_d4e = false;
        if (bVar2) {
          Request::get_header_value_abi_cxx11_
                    (&local_c60,(Request *)&res.is_chunked_content_provider_,"Connection",0);
          local_c61 = 1;
          local_d4e = std::operator!=(&local_c60,"Keep-Alive");
        }
        if ((local_c61 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c60);
        }
        if (local_d4e != false) {
          *connection_closed = true;
        }
        (*strm->_vptr_Stream[6])
                  (strm,(undefined1 *)((long)&req.body.field_2 + 8),
                   (undefined1 *)((long)&req.remote_addr.field_2 + 8));
        Request::set_header((Request *)&res.is_chunked_content_provider_,"REMOTE_ADDR",
                            (string *)((long)&req.body.field_2 + 8));
        std::__cxx11::to_string((string *)&range_header_value,req.remote_addr.field_2._8_4_);
        Request::set_header((Request *)&res.is_chunked_content_provider_,"REMOTE_PORT",
                            (string *)&range_header_value);
        std::__cxx11::string::~string((string *)&range_header_value);
        bVar2 = Request::has_header((Request *)&res.is_chunked_content_provider_,"Range");
        if (bVar2) {
          Request::get_header_value_abi_cxx11_
                    (&local_cb0,(Request *)&res.is_chunked_content_provider_,"Range",0);
          local_c90 = &local_cb0;
          bVar2 = detail::parse_range_header
                            (local_c90,
                             (Ranges *)&req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (!bVar2) {
            res.version.field_2._8_4_ = 0x1a0;
            this_local._7_1_ =
                 write_response(this,strm,close_connection,
                                (Request *)&res.is_chunked_content_provider_,
                                (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
          }
          req.authorization_count_._1_3_ = 0;
          req.authorization_count_._0_1_ = !bVar2;
          std::__cxx11::string::~string((string *)&local_cb0);
          if ((uint)req.authorization_count_ != 0) goto LAB_00139591;
        }
        bVar2 = std::function::operator_cast_to_bool((function *)setup_request);
        if (bVar2) {
          std::function<void_(httplib::Request_&)>::operator()
                    (setup_request,(Request *)&res.is_chunked_content_provider_);
        }
        Request::get_header_value_abi_cxx11_
                  ((string *)local_cd0,(Request *)&res.is_chunked_content_provider_,"Expect",0);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_cd0,"100-continue");
        std::__cxx11::string::~string((string *)local_cd0);
        if (bVar2) {
          local_cd4 = 100;
          bVar2 = std::function::operator_cast_to_bool
                            ((function *)&this->expect_100_continue_handler_);
          if (bVar2) {
            local_cd4 = std::function<int_(const_httplib::Request_&,_httplib::Response_&)>::
                        operator()(&this->expect_100_continue_handler_,
                                   (Request *)&res.is_chunked_content_provider_,
                                   (Response *)
                                   &dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if ((local_cd4 != 100) && (local_cd4 != 0x1a1)) {
            this_local._7_1_ =
                 write_response(this,strm,close_connection,
                                (Request *)&res.is_chunked_content_provider_,
                                (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            req.authorization_count_._0_4_ = 1;
            goto LAB_00139591;
          }
          pcStack_ce0 = detail::status_message(local_cd4);
          Stream::write_format<int,char_const*>
                    (strm,"HTTP/1.1 %d %s\r\n\r\n",&local_cd4,&stack0xfffffffffffff320);
        }
        bVar2 = routing(this,(Request *)&res.is_chunked_content_provider_,
                        (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count,strm);
        if (bVar2) {
          if (res.version.field_2._8_4_ == -1) {
            bVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
                    empty((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          &req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
            res.version.field_2._8_4_ = 0xce;
            if (bVar2) {
              res.version.field_2._8_4_ = 200;
            }
          }
          this_local._7_1_ =
               write_response_with_content
                         (this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                          (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
          req.authorization_count_._0_4_ = 1;
        }
        else {
          if (res.version.field_2._8_4_ == -1) {
            res.version.field_2._8_4_ = 0x194;
          }
          this_local._7_1_ =
               write_response(this,strm,close_connection,
                              (Request *)&res.is_chunked_content_provider_,
                              (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
          req.authorization_count_._0_4_ = 1;
        }
      }
      else {
        res.version.field_2._8_4_ = 400;
        this_local._7_1_ =
             write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                            (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
        req.authorization_count_._0_4_ = 1;
      }
    }
    else {
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c20);
      detail::read_headers
                (strm,(multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_c20);
      res.version.field_2._8_4_ = 0x19e;
      this_local._7_1_ =
           write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                          (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
      req.authorization_count_._0_4_ = 1;
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c20);
    }
  }
  else {
    psVar1 = &dummy_1._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)psVar1);
    detail::read_headers(strm,(Headers *)psVar1);
    res.version.field_2._8_4_ = 500;
    this_local._7_1_ =
         write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                        (Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
    req.authorization_count_._0_4_ = 1;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&dummy_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
LAB_00139591:
  Response::~Response((Response *)&dummy._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Request::~Request((Request *)&res.is_chunked_content_provider_);
LAB_001395c5:
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool
	Server::process_request(Stream &strm, bool close_connection,
							bool &connection_closed,
							const std::function<void(Request &)> &setup_request) {
		std::array<char, 2048> buf{};

		detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

		// Connection has been closed on client
		if (!line_reader.getline()) { return false; }

		Request req;
		Response res;

		res.version = "HTTP/1.1";

#ifdef _WIN32
		// TODO: Increase FD_SETSIZE statically (libzmq), dynamically (MySQL).
#else
#ifndef CPPHTTPLIB_USE_POLL
		// Socket file descriptor exceeded FD_SETSIZE...
		if (strm.socket() >= FD_SETSIZE) {
			Headers dummy;
			detail::read_headers(strm, dummy);
			res.status = 500;
			return write_response(strm, close_connection, req, res);
		}
#endif
#endif

		// Check if the request URI doesn't exceed the limit
		if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
			Headers dummy;
			detail::read_headers(strm, dummy);
			res.status = 414;
			return write_response(strm, close_connection, req, res);
		}

		// Request line and headers
		if (!parse_request_line(line_reader.ptr(), req) ||
			!detail::read_headers(strm, req.headers)) {
			res.status = 400;
			return write_response(strm, close_connection, req, res);
		}

		if (req.get_header_value("Connection") == "close") {
			connection_closed = true;
		}

		if (req.version == "HTTP/1.0" &&
			req.get_header_value("Connection") != "Keep-Alive") {
			connection_closed = true;
		}

		strm.get_remote_ip_and_port(req.remote_addr, req.remote_port);
		req.set_header("REMOTE_ADDR", req.remote_addr);
		req.set_header("REMOTE_PORT", std::to_string(req.remote_port));

		if (req.has_header("Range")) {
			const auto &range_header_value = req.get_header_value("Range");
			if (!detail::parse_range_header(range_header_value, req.ranges)) {
				res.status = 416;
				return write_response(strm, close_connection, req, res);
			}
		}

		if (setup_request) { setup_request(req); }

		if (req.get_header_value("Expect") == "100-continue") {
			auto status = 100;
			if (expect_100_continue_handler_) {
				status = expect_100_continue_handler_(req, res);
			}
			switch (status) {
				case 100:
				case 417:
					strm.write_format("HTTP/1.1 %d %s\r\n\r\n", status,
									  detail::status_message(status));
					break;
				default: return write_response(strm, close_connection, req, res);
			}
		}

		// Rounting
		bool routed = false;
		try {
			routed = routing(req, res, strm);
		} catch (std::exception & e) {
			if (exception_handler_) {
				exception_handler_(req, res, e);
				routed = true;
			} else {
				res.status = 500;
				res.set_header("EXCEPTION_WHAT", e.what());
			}
		} catch (...) {
			res.status = 500;
			res.set_header("EXCEPTION_WHAT", "UNKNOWN");
		}

		if (routed) {
			if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
			return write_response_with_content(strm, close_connection, req, res);
		} else {
			if (res.status == -1) { res.status = 404; }
			return write_response(strm, close_connection, req, res);
		}
	}